

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

string * SettingName(string *__return_storage_ptr__,string *arg)

{
  long lVar1;
  char *pcVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string *extraout_RAX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = (arg->_M_dataplus)._M_p;
  sVar3 = arg->_M_string_length;
  if ((sVar3 == 0) || (*pcVar2 != '-')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar3);
      return extraout_RAX;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                       (__return_storage_ptr__,arg,1,0xffffffffffffffff);
    return pbVar4;
  }
  __stack_chk_fail();
}

Assistant:

static std::string SettingName(const std::string& arg)
{
    return arg.size() > 0 && arg[0] == '-' ? arg.substr(1) : arg;
}